

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int test_ecmult_multi_random(secp256k1_scratch *scratch)

{
  undefined8 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  uint64_t in_RDI;
  secp256k1_scalar sc_1;
  secp256k1_gej gej_2;
  int j_1;
  secp256k1_gej gej_1;
  secp256k1_scalar sc;
  secp256k1_gej gej;
  int k;
  secp256k1_scalar iv;
  secp256k1_scalar v;
  int j;
  int rands;
  int mults;
  secp256k1_scalar *g_scalar_ptr;
  int g_nonzero;
  int nonzero_result;
  int num_nonzero;
  int num;
  int num_bits;
  secp256k1_ecmult_multi_func ecmult_multi;
  int fn;
  int i;
  ecmult_multi_data data;
  secp256k1_ge ges [128];
  secp256k1_ge ge_tmp;
  secp256k1_scalar sc_tmp;
  secp256k1_gej computed;
  secp256k1_gej expected;
  secp256k1_gej gejs [128];
  secp256k1_scalar scalars [128];
  secp256k1_scalar g_scalar;
  int filled;
  secp256k1_gej *in_stack_ffffffffffff7fc8;
  undefined8 in_stack_ffffffffffff7fd0;
  secp256k1_gej *psVar9;
  secp256k1_gej *r;
  int in_stack_ffffffffffff7fd8;
  int iVar10;
  int iVar11;
  code *pcVar12;
  secp256k1_scalar *r_00;
  secp256k1_scalar *in_stack_ffffffffffff7fe8;
  undefined8 uVar13;
  secp256k1_ge *in_stack_ffffffffffff7ff0;
  undefined8 uVar14;
  secp256k1_scalar *in_stack_ffffffffffff7ff8;
  undefined8 uVar15;
  secp256k1_scalar *in_stack_ffffffffffff8000;
  secp256k1_gej *in_stack_ffffffffffff8008;
  secp256k1_ge *in_stack_ffffffffffff8010;
  secp256k1_gej *in_stack_ffffffffffff8048;
  secp256k1_gej *in_stack_ffffffffffff8050;
  secp256k1_scalar *in_stack_ffffffffffff8100;
  secp256k1_gej *in_stack_ffffffffffff8108;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffff8110;
  undefined1 local_7ed0 [72];
  secp256k1_fe *in_stack_ffffffffffff8178;
  secp256k1_gej *in_stack_ffffffffffff8180;
  secp256k1_gej *in_stack_ffffffffffff8188;
  secp256k1_gej *in_stack_ffffffffffff8190;
  int local_7e04;
  uint32_t local_7e00;
  int local_7dfc;
  int local_7dcc;
  undefined8 *local_7dc8;
  undefined1 *local_7dc0;
  undefined1 local_7db8 [1456];
  secp256k1_scalar *in_stack_ffffffffffff87f8;
  secp256k1_scalar *in_stack_ffffffffffff8800;
  secp256k1_gej *in_stack_ffffffffffff8808;
  secp256k1_gej *in_stack_ffffffffffff8810;
  undefined1 local_5138 [256];
  undefined1 local_5038 [16384];
  undefined8 local_1038 [513];
  int local_c;
  uint64_t local_8;
  
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffff7fd0 >> 0x20);
  local_c = 0;
  local_8 = in_RDI;
  memset(&stack0xffffffffffffffd0,0,0x20);
  uVar2 = testrand_int(uVar3);
  if (uVar2 == 0) {
    pcVar12 = secp256k1_ecmult_multi_var;
  }
  else {
    pcVar12 = secp256k1_ecmult_pippenger_batch_single;
    if (uVar2 == 1) {
      pcVar12 = secp256k1_ecmult_strauss_batch_single;
    }
  }
  r_00 = (secp256k1_scalar *)pcVar12;
  testrand_int(uVar3);
  uVar2 = testrand_int(uVar3);
  uVar3 = testrand_int(uVar3);
  uVar6 = testrand_bits((int)((ulong)in_stack_ffffffffffff7fc8 >> 0x20));
  iVar5 = (int)uVar6;
  iVar10 = iVar5;
  if (uVar3 != 0) {
    if ((uVar3 == 1) && (iVar5 == 0)) {
      in_stack_ffffffffffff7fd8 = 1;
      iVar10 = in_stack_ffffffffffff7fd8;
    }
    else {
      uVar6 = testrand_bits((int)((ulong)in_stack_ffffffffffff7fc8 >> 0x20));
      in_stack_ffffffffffff7fd8 = (int)uVar6;
      iVar10 = in_stack_ffffffffffff7fd8;
    }
  }
  iVar11 = iVar10;
  if ((iVar10 == 0) &&
     (uVar6 = testrand_bits((int)((ulong)in_stack_ffffffffffff7fc8 >> 0x20)), uVar6 == 0)) {
    psVar9 = (secp256k1_gej *)0x0;
  }
  else {
    psVar9 = (secp256k1_gej *)&stack0xffffffffffffffd0;
  }
  local_7dfc = 0;
  r = psVar9;
  uVar6 = testrand_bits((int)((ulong)in_stack_ffffffffffff7fc8 >> 0x20));
  local_7e00 = (uint32_t)uVar6;
  if ((int)uVar3 < (int)(uint32_t)uVar6) {
    local_7e00 = uVar3;
  }
  secp256k1_gej_set_infinity((secp256k1_gej *)0x13e3da);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x13e3e7);
  secp256k1_scalar_set_int((secp256k1_scalar *)r,(uint)((ulong)in_stack_ffffffffffff7fc8 >> 0x20));
  if ((iVar10 != 0) &&
     (testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_ffffffffffff7ff0), iVar5 == 0))
  {
    if ((int)uVar3 <= local_c) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x131e,"test condition failed: num_nonzero > filled");
      abort();
    }
    testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_ffffffffffff7ff0);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)in_stack_ffffffffffff8010,
               (secp256k1_scalar *)in_stack_ffffffffffff8008,in_stack_ffffffffffff8000);
    secp256k1_scalar_inverse_var
              ((secp256k1_scalar *)in_stack_ffffffffffff7ff0,in_stack_ffffffffffff7fe8);
    secp256k1_scalar_negate(r_00,(secp256k1_scalar *)CONCAT44(iVar11,in_stack_ffffffffffff7fd8));
    secp256k1_ecmult_gen
              (in_stack_ffffffffffff8110,in_stack_ffffffffffff8108,in_stack_ffffffffffff8100);
    local_c = local_c + 1;
    local_7dfc = 1;
  }
  if ((iVar5 != 0) && (local_c < (int)uVar3)) {
    testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_ffffffffffff7ff0);
    testutil_random_ge_test(in_stack_ffffffffffff7ff0);
    secp256k1_gej_set_ge(r,(secp256k1_ge *)in_stack_ffffffffffff7fc8);
    local_c = local_c + 1;
  }
  if (iVar5 != 0) {
    if (1 < local_c) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1333,"test condition failed: filled <= 1");
      abort();
    }
    secp256k1_ecmult(in_stack_ffffffffffff8810,in_stack_ffffffffffff8808,in_stack_ffffffffffff8800,
                     in_stack_ffffffffffff87f8);
    local_7dfc = local_c + iVar10 + local_7dfc;
  }
  if ((int)(((iVar5 != 0 ^ 0xffU) & 1) + 1) < local_c) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1339,"test condition failed: filled <= 1 + !nonzero_result");
    abort();
  }
  if ((int)uVar3 < local_c) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x133a,"test condition failed: filled <= num_nonzero");
    abort();
  }
  for (; local_c < (int)uVar2; local_c = local_c + 1) {
    uVar6 = testrand_bits((int)((ulong)in_stack_ffffffffffff7fc8 >> 0x20));
    if (uVar6 == 0) {
      secp256k1_scalar_set_int
                ((secp256k1_scalar *)r,(uint)((ulong)in_stack_ffffffffffff7fc8 >> 0x20));
      testutil_random_ge_test(in_stack_ffffffffffff7ff0);
      secp256k1_gej_set_ge(r,(secp256k1_ge *)in_stack_ffffffffffff7fc8);
    }
    else {
      secp256k1_gej_set_infinity((secp256k1_gej *)0x13e734);
      testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_ffffffffffff7ff0);
    }
  }
  for (local_7dcc = 0; local_7dcc < (int)local_7e00; local_7dcc = local_7dcc + 1) {
    for (local_7e04 = 0; local_7e04 < (int)uVar3; local_7e04 = local_7e04 + 1) {
      uVar4 = testrand_int((uint32_t)((ulong)r >> 0x20));
      if (uVar4 != 0) {
        memcpy(local_7ed0,local_5038 + (long)local_7e04 * 0x80,0x80);
        lVar7 = (long)local_7e04;
        uVar13 = local_1038[lVar7 * 4];
        uVar14 = local_1038[lVar7 * 4 + 1];
        uVar15 = local_1038[lVar7 * 4 + 2];
        uVar1 = local_1038[lVar7 * 4 + 3];
        memcpy(local_5038 + (long)local_7e04 * 0x80,
               local_5038 + (long)(int)(local_7e04 + uVar4) * 0x80,0x80);
        lVar7 = (long)local_7e04;
        lVar8 = (long)(int)(local_7e04 + uVar4);
        local_1038[lVar7 * 4] = local_1038[lVar8 * 4];
        local_1038[lVar7 * 4 + 1] = local_1038[lVar8 * 4 + 1];
        local_1038[lVar7 * 4 + 2] = local_1038[lVar8 * 4 + 2];
        local_1038[lVar7 * 4 + 3] = local_1038[lVar8 * 4 + 3];
        memcpy(local_5038 + (long)(int)(local_7e04 + uVar4) * 0x80,local_7ed0,0x80);
        lVar7 = (long)(int)(local_7e04 + uVar4);
        local_1038[lVar7 * 4] = uVar13;
        local_1038[lVar7 * 4 + 1] = uVar14;
        local_1038[lVar7 * 4 + 2] = uVar15;
        local_1038[lVar7 * 4 + 3] = uVar1;
      }
    }
    for (local_7e04 = 0; local_7e04 + 1 < (int)uVar3; local_7e04 = local_7e04 + 2) {
      secp256k1_scalar_add
                (in_stack_ffffffffffff8000,in_stack_ffffffffffff7ff8,
                 (secp256k1_scalar *)in_stack_ffffffffffff7ff0);
      secp256k1_gej_neg(r,in_stack_ffffffffffff7fc8);
      secp256k1_gej_add_var
                (in_stack_ffffffffffff8190,in_stack_ffffffffffff8188,in_stack_ffffffffffff8180,
                 in_stack_ffffffffffff8178);
    }
    if ((int)uVar3 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1365,"test condition failed: num_nonzero >= 1");
      abort();
    }
    testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_ffffffffffff7ff0);
    secp256k1_scalar_inverse
              ((secp256k1_scalar *)in_stack_ffffffffffff7ff0,in_stack_ffffffffffff7fe8);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)in_stack_ffffffffffff8010,
               (secp256k1_scalar *)in_stack_ffffffffffff8008,in_stack_ffffffffffff8000);
    secp256k1_ecmult(in_stack_ffffffffffff8810,in_stack_ffffffffffff8808,in_stack_ffffffffffff8800,
                     in_stack_ffffffffffff87f8);
    local_7dfc = local_7dfc + 1;
  }
  for (local_7dcc = 0; local_7dcc < (int)uVar2; local_7dcc = local_7dcc + 1) {
    uVar4 = testrand_int((uint32_t)((ulong)r >> 0x20));
    if (uVar4 != 0) {
      memcpy(&stack0xffffffffffff8008,local_5038 + (long)local_7dcc * 0x80,0x80);
      lVar7 = (long)local_7dcc;
      uVar13 = local_1038[lVar7 * 4];
      uVar14 = local_1038[lVar7 * 4 + 1];
      uVar15 = local_1038[lVar7 * 4 + 2];
      in_stack_ffffffffffff8000 = (secp256k1_scalar *)local_1038[lVar7 * 4 + 3];
      memcpy(local_5038 + (long)local_7dcc * 0x80,
             local_5038 + (long)(int)(local_7dcc + uVar4) * 0x80,0x80);
      lVar7 = (long)local_7dcc;
      lVar8 = (long)(int)(local_7dcc + uVar4);
      local_1038[lVar7 * 4] = local_1038[lVar8 * 4];
      local_1038[lVar7 * 4 + 1] = local_1038[lVar8 * 4 + 1];
      local_1038[lVar7 * 4 + 2] = local_1038[lVar8 * 4 + 2];
      local_1038[lVar7 * 4 + 3] = local_1038[lVar8 * 4 + 3];
      memcpy(local_5038 + (long)(int)(local_7dcc + uVar4) * 0x80,&stack0xffffffffffff8008,0x80);
      lVar7 = (long)(int)(local_7dcc + uVar4);
      local_1038[lVar7 * 4] = uVar13;
      local_1038[lVar7 * 4 + 1] = uVar14;
      local_1038[lVar7 * 4 + 2] = uVar15;
      local_1038[lVar7 * 4 + 3] = in_stack_ffffffffffff8000;
    }
  }
  secp256k1_ge_set_all_gej_var
            (in_stack_ffffffffffff8010,in_stack_ffffffffffff8008,(size_t)in_stack_ffffffffffff8000);
  local_7dc8 = local_1038;
  local_7dc0 = local_7db8;
  iVar5 = (*pcVar12)(&CTX->error_callback,local_8,local_5138,psVar9,ecmult_multi_callback,
                     &local_7dc8,(long)local_c);
  if (iVar5 != 0) {
    iVar5 = secp256k1_gej_eq_var(in_stack_ffffffffffff8050,in_stack_ffffffffffff8048);
    if (iVar5 != 0) {
      return uVar3 + iVar10 + local_7dfc;
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1382,"test condition failed: secp256k1_gej_eq_var(&computed, &expected)");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x137f,
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &computed, g_scalar_ptr, ecmult_multi_callback, &data, filled)"
         );
  abort();
}

Assistant:

static int test_ecmult_multi_random(secp256k1_scratch *scratch) {
    /* Large random test for ecmult_multi_* functions which exercises:
     * - Few or many inputs (0 up to 128, roughly exponentially distributed).
     * - Few or many 0*P or a*INF inputs (roughly uniformly distributed).
     * - Including or excluding an nonzero a*G term (or such a term at all).
     * - Final expected result equal to infinity or not (roughly 50%).
     * - ecmult_multi_var, ecmult_strauss_single_batch, ecmult_pippenger_single_batch
     */

    /* These 4 variables define the eventual input to the ecmult_multi function.
     * g_scalar is the G scalar fed to it (or NULL, possibly, if g_scalar=0), and
     * scalars[0..filled-1] and gejs[0..filled-1] are the scalars and points
     * which form its normal inputs. */
    int filled = 0;
    secp256k1_scalar g_scalar = secp256k1_scalar_zero;
    secp256k1_scalar scalars[128];
    secp256k1_gej gejs[128];
    /* The expected result, and the computed result. */
    secp256k1_gej expected, computed;
    /* Temporaries. */
    secp256k1_scalar sc_tmp;
    secp256k1_ge ge_tmp;
    /* Variables needed for the actual input to ecmult_multi. */
    secp256k1_ge ges[128];
    ecmult_multi_data data;

    int i;
    /* Which multiplication function to use */
    int fn = testrand_int(3);
    secp256k1_ecmult_multi_func ecmult_multi = fn == 0 ? secp256k1_ecmult_multi_var :
                                               fn == 1 ? secp256k1_ecmult_strauss_batch_single :
                                               secp256k1_ecmult_pippenger_batch_single;
    /* Simulate exponentially distributed num. */
    int num_bits = 2 + testrand_int(6);
    /* Number of (scalar, point) inputs (excluding g). */
    int num = testrand_int((1 << num_bits) + 1);
    /* Number of those which are nonzero. */
    int num_nonzero = testrand_int(num + 1);
    /* Whether we're aiming to create an input with nonzero expected result. */
    int nonzero_result = testrand_bits(1);
    /* Whether we will provide nonzero g multiplicand. In some cases our hand
     * is forced here based on num_nonzero and nonzero_result. */
    int g_nonzero = num_nonzero == 0 ? nonzero_result :
                    num_nonzero == 1 && !nonzero_result ? 1 :
                    (int)testrand_bits(1);
    /* Which g_scalar pointer to pass into ecmult_multi(). */
    const secp256k1_scalar* g_scalar_ptr = (g_nonzero || testrand_bits(1)) ? &g_scalar : NULL;
    /* How many EC multiplications were performed in this function. */
    int mults = 0;
    /* How many randomization steps to apply to the input list. */
    int rands = (int)testrand_bits(3);
    if (rands > num_nonzero) rands = num_nonzero;

    secp256k1_gej_set_infinity(&expected);
    secp256k1_gej_set_infinity(&gejs[0]);
    secp256k1_scalar_set_int(&scalars[0], 0);

    if (g_nonzero) {
        /* If g_nonzero, set g_scalar to nonzero value r. */
        testutil_random_scalar_order_test(&g_scalar);
        if (!nonzero_result) {
            /* If expected=0 is desired, add a (a*r, -(1/a)*g) term to compensate. */
            CHECK(num_nonzero > filled);
            testutil_random_scalar_order_test(&sc_tmp);
            secp256k1_scalar_mul(&scalars[filled], &sc_tmp, &g_scalar);
            secp256k1_scalar_inverse_var(&sc_tmp, &sc_tmp);
            secp256k1_scalar_negate(&sc_tmp, &sc_tmp);
            secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &gejs[filled], &sc_tmp);
            ++filled;
            ++mults;
        }
    }

    if (nonzero_result && filled < num_nonzero) {
        /* If a nonzero result is desired, and there is space, add a random nonzero term. */
        testutil_random_scalar_order_test(&scalars[filled]);
        testutil_random_ge_test(&ge_tmp);
        secp256k1_gej_set_ge(&gejs[filled], &ge_tmp);
        ++filled;
    }

    if (nonzero_result) {
        /* Compute the expected result using normal ecmult. */
        CHECK(filled <= 1);
        secp256k1_ecmult(&expected, &gejs[0], &scalars[0], &g_scalar);
        mults += filled + g_nonzero;
    }

    /* At this point we have expected = scalar_g*G + sum(scalars[i]*gejs[i] for i=0..filled-1). */
    CHECK(filled <= 1 + !nonzero_result);
    CHECK(filled <= num_nonzero);

    /* Add entries to scalars,gejs so that there are num of them. All the added entries
     * either have scalar=0 or point=infinity, so these do not change the expected result. */
    while (filled < num) {
        if (testrand_bits(1)) {
            secp256k1_gej_set_infinity(&gejs[filled]);
            testutil_random_scalar_order_test(&scalars[filled]);
        } else {
            secp256k1_scalar_set_int(&scalars[filled], 0);
            testutil_random_ge_test(&ge_tmp);
            secp256k1_gej_set_ge(&gejs[filled], &ge_tmp);
        }
        ++filled;
    }

    /* Now perform cheapish transformations on gejs and scalars, for indices
     * 0..num_nonzero-1, which do not change the expected result, but may
     * convert some of them to be both non-0-scalar and non-infinity-point. */
    for (i = 0; i < rands; ++i) {
        int j;
        secp256k1_scalar v, iv;
        /* Shuffle the entries. */
        for (j = 0; j < num_nonzero; ++j) {
            int k = testrand_int(num_nonzero - j);
            if (k != 0) {
                secp256k1_gej gej = gejs[j];
                secp256k1_scalar sc = scalars[j];
                gejs[j] = gejs[j + k];
                scalars[j] = scalars[j + k];
                gejs[j + k] = gej;
                scalars[j + k] = sc;
            }
        }
        /* Perturb all consecutive pairs of inputs:
         * a*P + b*Q -> (a+b)*P + b*(Q-P). */
        for (j = 0; j + 1 < num_nonzero; j += 2) {
            secp256k1_gej gej;
            secp256k1_scalar_add(&scalars[j], &scalars[j], &scalars[j+1]);
            secp256k1_gej_neg(&gej, &gejs[j]);
            secp256k1_gej_add_var(&gejs[j+1], &gejs[j+1], &gej, NULL);
        }
        /* Transform the last input: a*P -> (v*a) * ((1/v)*P). */
        CHECK(num_nonzero >= 1);
        testutil_random_scalar_order_test(&v);
        secp256k1_scalar_inverse(&iv, &v);
        secp256k1_scalar_mul(&scalars[num_nonzero - 1], &scalars[num_nonzero - 1], &v);
        secp256k1_ecmult(&gejs[num_nonzero - 1], &gejs[num_nonzero - 1], &iv, NULL);
        ++mults;
    }

    /* Shuffle all entries (0..num-1). */
    for (i = 0; i < num; ++i) {
        int j = testrand_int(num - i);
        if (j != 0) {
            secp256k1_gej gej = gejs[i];
            secp256k1_scalar sc = scalars[i];
            gejs[i] = gejs[i + j];
            scalars[i] = scalars[i + j];
            gejs[i + j] = gej;
            scalars[i + j] = sc;
        }
    }

    /* Compute affine versions of all inputs. */
    secp256k1_ge_set_all_gej_var(ges, gejs, filled);
    /* Invoke ecmult_multi code. */
    data.sc = scalars;
    data.pt = ges;
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &computed, g_scalar_ptr, ecmult_multi_callback, &data, filled));
    mults += num_nonzero + g_nonzero;
    /* Compare with expected result. */
    CHECK(secp256k1_gej_eq_var(&computed, &expected));
    return mults;
}